

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

unsigned_long_long
ImGui::RoundScalarWithFormatT<unsigned_long_long,long_long>
          (char *format,ImGuiDataType data_type,unsigned_long_long v)

{
  char *pcVar1;
  char *pcVar2;
  double dVar3;
  undefined8 local_60;
  char v_str [64];
  
  local_60 = v;
  pcVar2 = ImParseFormatFindStart(format);
  if ((*pcVar2 == '%') && (pcVar2[1] != '%')) {
    ImFormatString(v_str,0x40,pcVar2,v);
    pcVar2 = (char *)((long)&local_60 + 7);
    do {
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar1 == ' ');
    if ((data_type & 0xfffffffeU) == 4) {
      dVar3 = atof(pcVar2);
      v = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
    }
    else {
      ImAtoi<long_long>(pcVar2,&local_60);
      v = local_60;
    }
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}